

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O3

void * operator_new__(size_t size)

{
  Sampler *pSVar1;
  byte bVar2;
  ThreadCache *this;
  undefined8 *puVar3;
  void *pvVar4;
  sbyte sVar5;
  FreeList *pFVar6;
  int iVar7;
  uint uVar8;
  undefined8 *in_FS_OFFSET;
  
  if ((base::internal::new_hooks_ == 0) &&
     (this = (ThreadCache *)*in_FS_OFFSET, this != (ThreadCache *)0x0)) {
    if (size < 0x401) {
      sVar5 = 3;
      iVar7 = 7;
    }
    else {
      if (0x40000 < size) goto LAB_00110c6c;
      sVar5 = 7;
      iVar7 = 0x3c7f;
    }
    bVar2 = (&tcmalloc::Static::sizemap_)[(uint)(iVar7 + (int)size) >> sVar5];
    iVar7 = (&DAT_0012d844)[bVar2];
    pSVar1 = &this->sampler_;
    pSVar1->bytes_until_sample_ = pSVar1->bytes_until_sample_ - (long)iVar7;
    if (-1 < pSVar1->bytes_until_sample_) {
      puVar3 = (undefined8 *)this->list_[bVar2].list_;
      if (puVar3 != (undefined8 *)0x0) {
        pFVar6 = this->list_ + bVar2;
        pFVar6->list_ = (void *)*puVar3;
        uVar8 = pFVar6->length_ - 1;
        pFVar6->length_ = uVar8;
        if (uVar8 < pFVar6->lowater_) {
          pFVar6->lowater_ = uVar8;
        }
        this->size_ = this->size_ - iVar7;
        return puVar3;
      }
      pvVar4 = tcmalloc::ThreadCache::FetchFromCentralCache
                         (this,(uint)bVar2,iVar7,tcmalloc::cpp_throw_oom);
      return pvVar4;
    }
    (this->sampler_).bytes_until_sample_ = (this->sampler_).bytes_until_sample_ + (long)iVar7;
  }
LAB_00110c6c:
  pvVar4 = tcmalloc::allocate_full_cpp_throw_oom(size);
  return pvVar4;
}

Assistant:

PERFTOOLS_DLL_DECL CACHELINE_ALIGNED_FN
void* tc_new(size_t size) {
  return malloc_fast_path<tcmalloc::cpp_throw_oom>(size);
}